

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_strategy.cpp
# Opt level: O0

FUNCTION_RETURN __thiscall
license::hw_identifier::DefaultStrategy::generate_pc_id(DefaultStrategy *this,HwIdentifier *pc_id)

{
  bool bVar1;
  reference pLVar2;
  pointer pIVar3;
  unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
  local_60;
  unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
  strategy_ptr;
  LCC_API_HW_IDENTIFICATION_STRATEGY strat_to_try;
  LCC_API_HW_IDENTIFICATION_STRATEGY it;
  iterator __end2;
  iterator __begin2;
  vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
  *__range2;
  undefined1 local_30 [4];
  FUNCTION_RETURN ret;
  vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
  strategy_to_try;
  HwIdentifier *pc_id_local;
  DefaultStrategy *this_local;
  
  strategy_to_try.
  super__Vector_base<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pc_id;
  available_strategies();
  __range2._4_4_ = FUNC_RET_NOT_AVAIL;
  __end2 = std::
           vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
           ::begin((vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
                    *)local_30);
  _strat_to_try =
       std::
       vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
       ::end((vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
              *)local_30);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<LCC_API_HW_IDENTIFICATION_STRATEGY_*,_std::vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>_>
                                     *)&strat_to_try), bVar1) {
    pLVar2 = __gnu_cxx::
             __normal_iterator<LCC_API_HW_IDENTIFICATION_STRATEGY_*,_std::vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>_>
             ::operator*(&__end2);
    strategy_ptr._M_t.
    super___uniq_ptr_impl<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
    ._M_t.
    super__Tuple_impl<0UL,_license::hw_identifier::IdentificationStrategy_*,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
    .super__Head_base<0UL,_license::hw_identifier::IdentificationStrategy_*,_false>._M_head_impl.
    _0_4_ = *pLVar2;
    strategy_ptr._M_t.
    super___uniq_ptr_impl<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
    ._M_t.
    super__Tuple_impl<0UL,_license::hw_identifier::IdentificationStrategy_*,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
    .super__Head_base<0UL,_license::hw_identifier::IdentificationStrategy_*,_false>._M_head_impl.
    _4_4_ = (LCC_API_HW_IDENTIFICATION_STRATEGY)
            strategy_ptr._M_t.
            super___uniq_ptr_impl<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
            ._M_t.
            super__Tuple_impl<0UL,_license::hw_identifier::IdentificationStrategy_*,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
            .super__Head_base<0UL,_license::hw_identifier::IdentificationStrategy_*,_false>.
            _M_head_impl;
    IdentificationStrategy::get_strategy
              ((IdentificationStrategy *)&local_60,
               (LCC_API_HW_IDENTIFICATION_STRATEGY)
               strategy_ptr._M_t.
               super___uniq_ptr_impl<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
               ._M_t.
               super__Tuple_impl<0UL,_license::hw_identifier::IdentificationStrategy_*,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
               .super__Head_base<0UL,_license::hw_identifier::IdentificationStrategy_*,_false>.
               _M_head_impl);
    pIVar3 = std::
             unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
             ::operator->(&local_60);
    __range2._4_4_ =
         (*pIVar3->_vptr_IdentificationStrategy[3])
                   (pIVar3,strategy_to_try.
                           super__Vector_base<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
    ::~unique_ptr(&local_60);
    if (__range2._4_4_ == FUNC_RET_OK) break;
    __gnu_cxx::
    __normal_iterator<LCC_API_HW_IDENTIFICATION_STRATEGY_*,_std::vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>::
  ~vector((vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
           *)local_30);
  return __range2._4_4_;
}

Assistant:

FUNCTION_RETURN DefaultStrategy::generate_pc_id(HwIdentifier& pc_id) const {
	vector<LCC_API_HW_IDENTIFICATION_STRATEGY> strategy_to_try = available_strategies();
	FUNCTION_RETURN ret = FUNC_RET_NOT_AVAIL;
	for (auto it : strategy_to_try) {
		LCC_API_HW_IDENTIFICATION_STRATEGY strat_to_try = it;
		unique_ptr<IdentificationStrategy> strategy_ptr = IdentificationStrategy::get_strategy(strat_to_try);
		ret = strategy_ptr->generate_pc_id(pc_id);
		if (ret == FUNC_RET_OK) {
			break;
		}
	}
	return ret;
}